

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

OptimizerResult
TasGrid::Optimizer::computeMaximum<(TasGrid::TypeOneDRule)19>
          (CurrentNodes<(TasGrid::TypeOneDRule)19> *current)

{
  double left_node;
  pointer current_00;
  uint uVar1;
  iterator __first;
  iterator __last;
  size_type sVar2;
  reference pvVar3;
  OptimizerResult OVar4;
  OptimizerResult OVar5;
  OptimizerResult OVar6;
  int local_94;
  int i;
  OptimizerResult thread_result;
  OptimizerResult thread_max;
  OptimizerResult right_result;
  anon_class_8_1_c685f059 func;
  int num_intervals;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> sorted;
  CurrentNodes<(TasGrid::TypeOneDRule)19> *current_local;
  OptimizerResult max_result;
  
  sorted.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)current;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,&current->nodes);
  __first = ::std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_38);
  __last = ::std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_38);
  ::std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current);
  sVar2 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_38);
  right_result.value =
       (double)sorted.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  OVar4 = computeMaximum<(TasGrid::TypeOneDRule)19>::anon_class_8_1_c685f059::operator()
                    ((anon_class_8_1_c685f059 *)&right_result.value,-1.0);
  OVar5 = computeMaximum<(TasGrid::TypeOneDRule)19>::anon_class_8_1_c685f059::operator()
                    ((anon_class_8_1_c685f059 *)&right_result.value,1.0);
  right_result.node = OVar5.value;
  if (OVar4.value < right_result.node) {
    OVar4 = OVar5;
  }
  OVar5 = OVar4;
  for (local_94 = 0;
      current_00 = sorted.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage, thread_max.node = OVar5.value,
      max_result.node = OVar4.value, local_94 < (int)sVar2 + -1; local_94 = local_94 + 1) {
    pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,(long)local_94);
    left_node = *pvVar3;
    pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,(long)(local_94 + 1));
    OVar6 = computeLocalMaximum<(TasGrid::TypeOneDRule)19>
                      ((CurrentNodes<(TasGrid::TypeOneDRule)19> *)current_00,left_node,*pvVar3);
    uVar1 = ::std::isnan(OVar6.value);
    if (((uVar1 & 1) == 0) && (thread_max.node < OVar6.value)) {
      OVar5 = OVar6;
    }
  }
  if (max_result.node < thread_max.node) {
    OVar4 = OVar5;
  }
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return OVar4;
}

Assistant:

OptimizerResult computeMaximum(CurrentNodes<rule> const& current){
    std::vector<double> sorted = current.nodes;
    std::sort(sorted.begin(), sorted.end());
    int num_intervals = (int) sorted.size() - 1;

    auto func = [&](double x)->OptimizerResult{ return {x, getValue<rule>(current, x)}; };

    OptimizerResult max_result = func(-1.0);

    OptimizerResult right_result = func(1.0);

    if (right_result.value > max_result.value)
        max_result = right_result;

    #pragma omp parallel
    {
        OptimizerResult thread_max = max_result, thread_result;

        #pragma omp for schedule(dynamic)
        for(int i=0; i<num_intervals; i++){
            thread_result = computeLocalMaximum(current, sorted[i], sorted[i+1]);
            if ((!std::isnan(thread_result.value)) && (thread_result.value > thread_max.value))
                thread_max = thread_result;
        }

        #pragma omp critical
        {
            if (thread_max.value > max_result.value){
                max_result = thread_max;
            }
        }
    }

    return max_result;
}